

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItemPrivate::resolveDepth(QGraphicsItemPrivate *this)

{
  QGraphicsItemPrivate *this_00;
  int iVar1;
  
  if (this->parent == (QGraphicsItem *)0x0) {
    iVar1 = 0;
  }
  else {
    this_00 = (this->parent->d_ptr).d;
    if (this_00->itemDepth == -1) {
      resolveDepth(this_00);
    }
    iVar1 = ((this->parent->d_ptr).d)->itemDepth + 1;
  }
  this->itemDepth = iVar1;
  return;
}

Assistant:

void QGraphicsItemPrivate::resolveDepth()
{
    if (!parent)
        itemDepth = 0;
    else {
        if (parent->d_ptr->itemDepth == -1)
            parent->d_ptr->resolveDepth();
        itemDepth = parent->d_ptr->itemDepth + 1;
    }
}